

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

longdouble * __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::min(quadratic_cost_type<long_double> *this,int n)

{
  longdouble lVar1;
  quad *pqVar2;
  longdouble lVar3;
  long lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  
  lVar3 = (longdouble)0;
  lVar7 = _DAT_00551a60;
  for (lVar4 = 0; (ulong)(uint)n << 4 != lVar4; lVar4 = lVar4 + 0x10) {
    lVar1 = *(longdouble *)
             ((long)(this->linear_elements)._M_t.
                    super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                    super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                    super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar4);
    lVar5 = ABS(lVar1);
    lVar6 = lVar7;
    if (lVar5 <= lVar7 || lVar7 != lVar5) {
      lVar6 = lVar5;
    }
    if (lVar3 != lVar1) {
      lVar7 = lVar6;
    }
    if (NAN(lVar3) || NAN(lVar1)) {
      lVar7 = lVar6;
    }
  }
  pqVar2 = (this->quadratic_elements)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
           .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>.
           _M_head_impl;
  for (lVar4 = 0;
      (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
                   .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[n] << 5 != lVar4;
      lVar4 = lVar4 + 0x20) {
    lVar1 = *(longdouble *)((long)&pqVar2->factor + lVar4);
    lVar5 = ABS(lVar1);
    lVar6 = lVar7;
    if (lVar5 <= lVar7 || lVar7 != lVar5) {
      lVar6 = lVar5;
    }
    if (lVar3 != lVar1) {
      lVar7 = lVar6;
    }
    if (NAN(lVar3) || NAN(lVar1)) {
      lVar7 = lVar6;
    }
  }
  return &pqVar2->factor;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        for (int i = 0, e = indices[n]; i != e; ++i)
            if (quadratic_elements[i].factor)
                min = std::min(min, std::abs(quadratic_elements[i].factor));

        return min;
    }